

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LNode.h
# Opt level: O2

void __thiscall
LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
~LNodeData(LNodeData<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *this)

{
  ~LNodeData(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

~LNodeData() override = default;